

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctfst.c
# Opt level: O3

void jpeg_fdct_ifast(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  DCTELEM *pDVar4;
  int *piVar5;
  int *piVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar30;
  uint uVar31;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  undefined1 auVar32 [16];
  uint uVar37;
  uint uVar41;
  uint uVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar43;
  int iVar46;
  int iVar47;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar49;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar57;
  int iVar64;
  int iVar65;
  uint uVar66;
  int iVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar68;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  
  uVar10 = (ulong)start_col;
  lVar11 = 0;
  do {
    lVar9 = *(long *)((long)sample_data + lVar11);
    bVar7 = *(byte *)(lVar9 + 7 + uVar10);
    iVar17 = (uint)bVar7 + (uint)*(byte *)(lVar9 + uVar10);
    iVar12 = (uint)*(byte *)(lVar9 + uVar10) - (uint)bVar7;
    bVar7 = *(byte *)(lVar9 + 1 + uVar10);
    bVar8 = *(byte *)(lVar9 + 6 + uVar10);
    iVar13 = (uint)bVar8 + (uint)bVar7;
    iVar15 = (uint)bVar7 - (uint)bVar8;
    bVar7 = *(byte *)(lVar9 + 2 + uVar10);
    bVar8 = *(byte *)(lVar9 + 5 + uVar10);
    iVar19 = (uint)bVar8 + (uint)bVar7;
    iVar16 = (uint)bVar7 - (uint)bVar8;
    bVar7 = *(byte *)(lVar9 + 3 + uVar10);
    bVar8 = *(byte *)(lVar9 + 4 + uVar10);
    iVar18 = (uint)bVar8 + (uint)bVar7;
    iVar14 = iVar18 + iVar17;
    iVar17 = iVar17 - iVar18;
    iVar18 = iVar19 + iVar13;
    data[lVar11] = iVar14 + iVar18 + -0x400;
    data[lVar11 + 4] = iVar14 - iVar18;
    iVar14 = ((iVar13 - iVar19) + iVar17) * 0xb5 >> 8;
    data[lVar11 + 2] = iVar14 + iVar17;
    data[lVar11 + 6] = iVar17 - iVar14;
    iVar13 = ((uint)bVar7 - (uint)bVar8) + iVar16;
    iVar14 = iVar15 + iVar12;
    iVar18 = (iVar13 - iVar14) * 0x62 >> 8;
    iVar17 = (iVar13 * 0x8b >> 8) + iVar18;
    iVar18 = (iVar14 * 0x14e >> 8) + iVar18;
    iVar13 = (iVar16 + iVar15) * 0xb5 >> 8;
    iVar14 = iVar13 + iVar12;
    iVar12 = iVar12 - iVar13;
    data[lVar11 + 5] = iVar17 + iVar12;
    data[lVar11 + 3] = iVar12 - iVar17;
    data[lVar11 + 1] = iVar18 + iVar14;
    data[lVar11 + 7] = iVar14 - iVar18;
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x40);
  lVar11 = -8;
  do {
    piVar5 = data + lVar11 + 0x40;
    piVar1 = data + lVar11 + 8;
    piVar2 = data + lVar11 + 0x10;
    piVar3 = data + lVar11 + 0x18;
    piVar6 = data + lVar11 + 0x20;
    iVar14 = *piVar6;
    iVar18 = piVar6[1];
    iVar12 = piVar6[2];
    iVar13 = piVar6[3];
    iVar43 = *piVar5 + *piVar1;
    iVar46 = piVar5[1] + piVar1[1];
    iVar47 = piVar5[2] + piVar1[2];
    iVar48 = piVar5[3] + piVar1[3];
    iVar20 = *piVar1 - *piVar5;
    iVar21 = piVar1[1] - piVar5[1];
    iVar22 = piVar1[2] - piVar5[2];
    iVar23 = piVar1[3] - piVar5[3];
    piVar1 = data + lVar11 + 0x38;
    iVar57 = *piVar1 + *piVar2;
    iVar64 = piVar1[1] + piVar2[1];
    iVar65 = piVar1[2] + piVar2[2];
    iVar67 = piVar1[3] + piVar2[3];
    iVar30 = *piVar2 - *piVar1;
    iVar33 = piVar2[1] - piVar1[1];
    iVar34 = piVar2[2] - piVar1[2];
    iVar36 = piVar2[3] - piVar1[3];
    piVar1 = data + lVar11 + 0x30;
    iVar68 = *piVar1 + *piVar3;
    iVar71 = piVar1[1] + piVar3[1];
    iVar72 = piVar1[2] + piVar3[2];
    iVar73 = piVar1[3] + piVar3[3];
    iVar24 = *piVar3 - *piVar1;
    iVar27 = piVar3[1] - piVar1[1];
    iVar28 = piVar3[2] - piVar1[2];
    iVar29 = piVar3[3] - piVar1[3];
    piVar1 = data + lVar11 + 0x28;
    iVar15 = *piVar1;
    iVar16 = piVar1[1];
    iVar17 = piVar1[2];
    iVar19 = piVar1[3];
    iVar74 = iVar15 + iVar14;
    iVar75 = iVar16 + iVar18;
    iVar76 = iVar17 + iVar12;
    iVar77 = iVar19 + iVar13;
    iVar49 = iVar74 + iVar43;
    iVar54 = iVar75 + iVar46;
    iVar55 = iVar76 + iVar47;
    iVar56 = iVar77 + iVar48;
    iVar43 = iVar43 - iVar74;
    iVar46 = iVar46 - iVar75;
    iVar47 = iVar47 - iVar76;
    iVar48 = iVar48 - iVar77;
    iVar74 = iVar68 + iVar57;
    iVar75 = iVar71 + iVar64;
    iVar76 = iVar72 + iVar65;
    iVar77 = iVar73 + iVar67;
    pDVar4 = data + lVar11 + 8;
    *pDVar4 = iVar49 + iVar74;
    pDVar4[1] = iVar54 + iVar75;
    pDVar4[2] = iVar55 + iVar76;
    pDVar4[3] = iVar56 + iVar77;
    pDVar4 = data + lVar11 + 0x28;
    *pDVar4 = iVar49 - iVar74;
    pDVar4[1] = iVar54 - iVar75;
    pDVar4[2] = iVar55 - iVar76;
    pDVar4[3] = iVar56 - iVar77;
    auVar58._0_4_ = (iVar57 - iVar68) + iVar43;
    auVar58._4_4_ = (iVar64 - iVar71) + iVar46;
    uVar66 = (iVar65 - iVar72) + iVar47;
    auVar58._12_4_ = (iVar67 - iVar73) + iVar48;
    auVar50._4_4_ = auVar58._12_4_;
    auVar50._0_4_ = uVar66;
    auVar50._8_4_ = auVar58._12_4_;
    auVar50._12_4_ = auVar58._12_4_;
    auVar58._8_4_ = auVar58._4_4_;
    auVar69._0_4_ = -(uint)((int)auVar58._0_4_ < 0);
    auVar69._4_4_ = -(uint)(auVar58._4_4_ < 0);
    auVar69._8_4_ = -(uint)(auVar58._4_4_ < 0);
    auVar69._12_4_ = -(uint)(auVar58._12_4_ < 0);
    auVar59._0_4_ = -(uint)((int)uVar66 < 0);
    auVar59._4_4_ = -(uint)(auVar58._12_4_ < 0);
    auVar59._8_4_ = -(uint)(auVar58._12_4_ < 0);
    auVar59._12_4_ = -(uint)(auVar58._12_4_ < 0);
    iVar49 = (int)(((ulong)auVar59._0_4_ * 0xb5 << 0x20) + (ulong)uVar66 * 0xb5 >> 8);
    iVar54 = (int)(((auVar59._8_8_ & 0xffffffff) * 0xb5 << 0x20) +
                   (auVar50._8_8_ & 0xffffffff) * 0xb5 >> 8);
    iVar55 = (int)(((ulong)auVar69._0_4_ * 0xb5 << 0x20) + (ulong)auVar58._0_4_ * 0xb5 >> 8);
    iVar56 = (int)(((auVar69._8_8_ & 0xffffffff) * 0xb5 << 0x20) +
                   (auVar58._8_8_ & 0xffffffff) * 0xb5 >> 8);
    pDVar4 = data + lVar11 + 0x18;
    *pDVar4 = iVar43 + iVar55;
    pDVar4[1] = iVar46 + iVar56;
    pDVar4[2] = iVar47 + iVar49;
    pDVar4[3] = iVar48 + iVar54;
    pDVar4 = data + lVar11 + 0x38;
    *pDVar4 = iVar43 - iVar55;
    pDVar4[1] = iVar46 - iVar56;
    pDVar4[2] = iVar47 - iVar49;
    pDVar4[3] = iVar48 - iVar54;
    uVar37 = (iVar14 - iVar15) + iVar24;
    iVar14 = (iVar18 - iVar16) + iVar27;
    uVar41 = (iVar12 - iVar17) + iVar28;
    iVar18 = (iVar13 - iVar19) + iVar29;
    auVar25._0_4_ = iVar24 + iVar30;
    auVar25._4_4_ = iVar27 + iVar33;
    uVar66 = iVar28 + iVar34;
    auVar25._12_4_ = iVar29 + iVar36;
    uVar31 = iVar30 + iVar20;
    iVar33 = iVar33 + iVar21;
    uVar35 = iVar34 + iVar22;
    iVar36 = iVar36 + iVar23;
    auVar51._4_4_ = iVar18;
    auVar51._0_4_ = uVar41;
    auVar51._8_4_ = iVar18;
    auVar51._12_4_ = iVar18;
    auVar60._4_4_ = iVar14;
    auVar60._0_4_ = uVar37;
    auVar60._8_4_ = iVar14;
    auVar60._12_4_ = iVar18;
    auVar38._0_4_ = uVar37 - uVar31;
    auVar38._4_4_ = iVar14 - iVar33;
    uVar42 = uVar41 - uVar35;
    auVar38._12_4_ = iVar18 - iVar36;
    auVar70._4_4_ = auVar38._12_4_;
    auVar70._0_4_ = uVar42;
    auVar70._8_4_ = auVar38._12_4_;
    auVar70._12_4_ = auVar38._12_4_;
    auVar38._8_4_ = auVar38._4_4_;
    auVar44._0_4_ = -(uint)((int)auVar38._0_4_ < 0);
    auVar44._4_4_ = -(uint)(auVar38._4_4_ < 0);
    auVar44._8_4_ = -(uint)(auVar38._4_4_ < 0);
    auVar44._12_4_ = -(uint)(auVar38._12_4_ < 0);
    auVar39._0_4_ = -(uint)((int)uVar42 < 0);
    auVar39._4_4_ = -(uint)(auVar38._12_4_ < 0);
    auVar39._8_4_ = -(uint)(auVar38._12_4_ < 0);
    auVar39._12_4_ = -(uint)(auVar38._12_4_ < 0);
    iVar24 = (int)(((ulong)auVar39._0_4_ * 0x62 << 0x20) + (ulong)uVar42 * 0x62 >> 8);
    iVar27 = (int)(((auVar39._8_8_ & 0xffffffff) * 0x62 << 0x20) +
                   (auVar70._8_8_ & 0xffffffff) * 0x62 >> 8);
    iVar17 = (int)(((ulong)auVar44._0_4_ * 0x62 << 0x20) + (ulong)auVar38._0_4_ * 0x62 >> 8);
    iVar19 = (int)(((auVar44._8_8_ & 0xffffffff) * 0x62 << 0x20) +
                   (auVar38._8_8_ & 0xffffffff) * 0x62 >> 8);
    auVar40._0_4_ = -(uint)((int)uVar37 < 0);
    auVar40._4_4_ = -(uint)(iVar14 < 0);
    auVar40._8_4_ = -(uint)(iVar14 < 0);
    auVar40._12_4_ = -(uint)(iVar18 < 0);
    auVar61._0_4_ = -(uint)((int)uVar41 < 0);
    auVar61._4_4_ = -(uint)(iVar18 < 0);
    auVar61._8_4_ = -(uint)(iVar18 < 0);
    auVar61._12_4_ = -(uint)(iVar18 < 0);
    iVar28 = (int)(((ulong)auVar40._0_4_ * 0x8b << 0x20) + (ulong)uVar37 * 0x8b >> 8) + iVar17;
    iVar29 = (int)(((auVar40._8_8_ & 0xffffffff) * 0x8b << 0x20) +
                   (auVar60._8_8_ & 0xffffffff) * 0x8b >> 8) + iVar19;
    iVar30 = (int)(((ulong)auVar61._0_4_ * 0x8b << 0x20) + (ulong)uVar41 * 0x8b >> 8) + iVar24;
    iVar34 = (int)(((auVar61._8_8_ & 0xffffffff) * 0x8b << 0x20) +
                   (auVar51._8_8_ & 0xffffffff) * 0x8b >> 8) + iVar27;
    auVar52._4_4_ = iVar36;
    auVar52._0_4_ = uVar35;
    auVar52._8_4_ = iVar36;
    auVar52._12_4_ = iVar36;
    auVar62._4_4_ = iVar33;
    auVar62._0_4_ = uVar31;
    auVar62._8_4_ = iVar33;
    auVar62._12_4_ = iVar36;
    auVar32._0_4_ = -(uint)((int)uVar31 < 0);
    auVar32._4_4_ = -(uint)(iVar33 < 0);
    auVar32._8_4_ = -(uint)(iVar33 < 0);
    auVar32._12_4_ = -(uint)(iVar36 < 0);
    auVar63._0_4_ = -(uint)((int)uVar35 < 0);
    auVar63._4_4_ = -(uint)(iVar36 < 0);
    auVar63._8_4_ = -(uint)(iVar36 < 0);
    auVar63._12_4_ = -(uint)(iVar36 < 0);
    iVar17 = (int)(((ulong)auVar32._0_4_ * 0x14e << 0x20) + (ulong)uVar31 * 0x14e >> 8) + iVar17;
    iVar19 = (int)(((auVar32._8_8_ & 0xffffffff) * 0x14e << 0x20) +
                   (auVar62._8_8_ & 0xffffffff) * 0x14e >> 8) + iVar19;
    iVar24 = (int)(((ulong)auVar63._0_4_ * 0x14e << 0x20) + (ulong)uVar35 * 0x14e >> 8) + iVar24;
    iVar27 = (int)(((auVar63._8_8_ & 0xffffffff) * 0x14e << 0x20) +
                   (auVar52._8_8_ & 0xffffffff) * 0x14e >> 8) + iVar27;
    auVar45._4_4_ = auVar25._12_4_;
    auVar45._0_4_ = uVar66;
    auVar45._8_4_ = auVar25._12_4_;
    auVar45._12_4_ = auVar25._12_4_;
    auVar25._8_4_ = auVar25._4_4_;
    auVar53._0_4_ = -(uint)((int)auVar25._0_4_ < 0);
    auVar53._4_4_ = -(uint)(auVar25._4_4_ < 0);
    auVar53._8_4_ = -(uint)(auVar25._4_4_ < 0);
    auVar53._12_4_ = -(uint)(auVar25._12_4_ < 0);
    auVar26._0_4_ = -(uint)((int)uVar66 < 0);
    auVar26._4_4_ = -(uint)(auVar25._12_4_ < 0);
    auVar26._8_4_ = -(uint)(auVar25._12_4_ < 0);
    auVar26._12_4_ = -(uint)(auVar25._12_4_ < 0);
    iVar14 = (int)(((ulong)auVar26._0_4_ * 0xb5 << 0x20) + (ulong)uVar66 * 0xb5 >> 8);
    iVar13 = (int)(((auVar26._8_8_ & 0xffffffff) * 0xb5 << 0x20) +
                   (auVar45._8_8_ & 0xffffffff) * 0xb5 >> 8);
    iVar33 = (int)(((ulong)auVar53._0_4_ * 0xb5 << 0x20) + (ulong)auVar25._0_4_ * 0xb5 >> 8);
    iVar36 = (int)(((auVar53._8_8_ & 0xffffffff) * 0xb5 << 0x20) +
                   (auVar25._8_8_ & 0xffffffff) * 0xb5 >> 8);
    iVar18 = iVar20 + iVar33;
    iVar12 = iVar21 + iVar36;
    iVar15 = iVar22 + iVar14;
    iVar16 = iVar23 + iVar13;
    iVar20 = iVar20 - iVar33;
    iVar21 = iVar21 - iVar36;
    iVar22 = iVar22 - iVar14;
    iVar23 = iVar23 - iVar13;
    pDVar4 = data + lVar11 + 0x30;
    *pDVar4 = iVar28 + iVar20;
    pDVar4[1] = iVar29 + iVar21;
    pDVar4[2] = iVar30 + iVar22;
    pDVar4[3] = iVar34 + iVar23;
    pDVar4 = data + lVar11 + 0x20;
    *pDVar4 = iVar20 - iVar28;
    pDVar4[1] = iVar21 - iVar29;
    pDVar4[2] = iVar22 - iVar30;
    pDVar4[3] = iVar23 - iVar34;
    pDVar4 = data + lVar11 + 0x10;
    *pDVar4 = iVar17 + iVar18;
    pDVar4[1] = iVar19 + iVar12;
    pDVar4[2] = iVar24 + iVar15;
    pDVar4[3] = iVar27 + iVar16;
    pDVar4 = data + lVar11 + 0x40;
    *pDVar4 = iVar18 - iVar17;
    pDVar4[1] = iVar12 - iVar19;
    pDVar4[2] = iVar15 - iVar24;
    pDVar4[3] = iVar16 - iVar27;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_ifast (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z1, z2, z3, z4, z5, z11, z13;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp7 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp6 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp5 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);
    tmp4 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}